

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,unsigned_int,std::__cxx11::string>
::load_impl_sequence<0ul,1ul,2ul,3ul>
          (argument_loader<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>,unsigned_int,std::__cxx11::string>
           *this,long call)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RAX;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar2 = list_caster<std::vector<double,_std::allocator<double>_>,_double>::load
                    ((list_caster<std::vector<double,_std::allocator<double>_>,_double> *)
                     (this + 0x40),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  uStack_18._0_5_ = CONCAT14(bVar2,(undefined4)uStack_18);
  bVar2 = list_caster<std::vector<double,_std::allocator<double>_>,_double>::load
                    ((list_caster<std::vector<double,_std::allocator<double>_>,_double> *)
                     (this + 0x28),*(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  uStack_18._0_6_ = CONCAT15(bVar2,(undefined5)uStack_18);
  bVar2 = type_caster<unsigned_int,_void>::load
                    ((type_caster<unsigned_int,_void> *)(this + 0x20),
                     *(PyObject **)(*(long *)(call + 8) + 0x10),
                     SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  uStack_18._0_7_ = CONCAT16(bVar2,(undefined6)uStack_18);
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          *)this,*(PyObject **)(*(long *)(call + 8) + 0x18),
         SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
  if ((char)((ulong)uStack_18 >> 0x20) == '\x01') {
    lVar3 = 1;
    do {
      bVar2 = lVar3 == 4;
      if (bVar2) {
        return bVar2;
      }
      lVar1 = lVar3 + 4;
      lVar3 = lVar3 + 1;
    } while (*(char *)((long)&uStack_18 + lVar1) != '\0');
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }